

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVMValidator.cpp
# Opt level: O2

Result * CoreML::validateKernel(Result *__return_storage_ptr__,Kernel *kernel)

{
  PolyKernel *pPVar1;
  SigmoidKernel *pSVar2;
  RBFKernel *pRVar3;
  allocator<char> local_31;
  string local_30;
  
  switch(kernel->_oneof_case_[0]) {
  case 1:
    break;
  case 3:
    pPVar1 = Specification::Kernel::polykernel(kernel);
    if (pPVar1->gamma_ <= 0.0 && pPVar1->gamma_ != 0.0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_30,"Gamma must be greater than or equal to zero",&local_31);
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_30);
      goto LAB_00240e5a;
    }
    pPVar1 = Specification::Kernel::polykernel(kernel);
    if (pPVar1->degree_ < 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_30,"Degree must be greater than or equal to zero",&local_31);
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_30);
      goto LAB_00240e5a;
    }
  case 2:
    pRVar3 = Specification::Kernel::rbfkernel(kernel);
    if (pRVar3->gamma_ <= 0.0 && pRVar3->gamma_ != 0.0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_30,"Gamma must be greater than or equal to zero",&local_31);
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_30);
LAB_00240e5a:
      std::__cxx11::string::~string((string *)&local_30);
      return __return_storage_ptr__;
    }
    break;
  case 4:
    pSVar2 = Specification::Kernel::sigmoidkernel(kernel);
    if (pSVar2->gamma_ <= 0.0 && pSVar2->gamma_ != 0.0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_30,"Gamma must be greater than or equal to zero",&local_31);
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_30);
      goto LAB_00240e5a;
    }
    break;
  default:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"You must specify a supported kernel type",&local_31);
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_30);
    goto LAB_00240e5a;
  }
  Result::Result(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Result validateKernel(const Specification::Kernel& kernel) {
        switch (kernel.kernel_case()) {
            case Specification::Kernel::kPolyKernel:
                if(kernel.polykernel().gamma() < 0)
                    return Result(ResultType::INVALID_MODEL_PARAMETERS, "Gamma must be greater than or equal to zero");
                if(kernel.polykernel().degree() < 0)
                    return Result(ResultType::INVALID_MODEL_PARAMETERS, "Degree must be greater than or equal to zero");
            case Specification::Kernel::kRbfKernel:
                if(kernel.rbfkernel().gamma() < 0)
                    return Result(ResultType::INVALID_MODEL_PARAMETERS, "Gamma must be greater than or equal to zero");
                break;
            case Specification::Kernel::kSigmoidKernel:
                if(kernel.sigmoidkernel().gamma() < 0)
                    return Result(ResultType::INVALID_MODEL_PARAMETERS, "Gamma must be greater than or equal to zero");
            case Specification::Kernel::kLinearKernel:
                break;
            default:
                return Result(ResultType::INVALID_MODEL_PARAMETERS, "You must specify a supported kernel type");
        }
        return Result();
    }